

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugger.cxx
# Opt level: O3

void __thiscall
cmDebugger_impl::OnWatchCallback
          (cmDebugger_impl *this,string *variable,int access_type,char *newValue)

{
  _Rb_tree_header *p_Var1;
  long *plVar2;
  _Base_ptr p_Var3;
  allocator local_61;
  cmDebugger_impl *local_60;
  char *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  if ((this->state)._M_i != Paused) {
    p_Var3 = (this->listeners)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->listeners)._M_t._M_impl.super__Rb_tree_header;
    local_60 = this;
    local_58 = newValue;
    if ((_Rb_tree_header *)p_Var3 != p_Var1) {
      do {
        plVar2 = *(long **)(p_Var3 + 1);
        std::__cxx11::string::string((string *)local_50,local_58,&local_61);
        (**(code **)(*plVar2 + 0x20))(plVar2,variable,access_type,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var1);
    }
    PauseExecution(local_60);
  }
  return;
}

Assistant:

void OnWatchCallback(const std::string& variable, int access_type,
                       const char* newValue)
  {
    // It's possible that this is triggered by the user setting / reading the
    // variable via the debugger;
    // in which case we can't pause and shouldn't notify listeners.
    if (state != State::Paused) {
      for (auto& l : listeners) {
        l->OnWatchpoint(variable, access_type, newValue);
      }
      PauseExecution();
    }
  }